

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_wrap.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Thread *this;
  duration<long,_std::ratio<1L,_1L>_> local_10;
  
  this = (Thread *)operator_new(0x18);
  (this->_thread)._M_id._M_thread = 0;
  this->_vptr_Thread = (_func_int **)0x0;
  *(undefined8 *)&this->_stop = 0;
  this->_vptr_Thread = (_func_int **)&PTR__Thread_00103d48;
  Thread::start(this);
  local_10.__r = 1;
  std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&local_10);
  Thread::join(this);
  (*this->_vptr_Thread[1])(this);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	Thread* t = new DerivedThread();
	t->start();
	std::this_thread::sleep_for(std::chrono::seconds(1));
	t->join();
	delete t;

	return 0;
}